

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

void flatbuffers::ResizeVector<flatbuffers::Offset<flatbuffers::String>>
               (Schema *schema,uoffset_t newsize,Offset<flatbuffers::String> val,
               Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,Object *root_table)

{
  uint uVar1;
  uint num_elems;
  uint8_t *puVar2;
  bool is_scalar;
  uint8_t *loc;
  int i;
  uint8_t *newelems;
  int delta_elem;
  Object *root_table_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf_local;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_local;
  uoffset_t newsize_local;
  Schema *schema_local;
  Offset<flatbuffers::String> val_local;
  
  uVar1 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::size(vec);
  num_elems = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::size(vec);
  puVar2 = ResizeAnyVector(schema,newsize,(VectorOfAny *)vec,num_elems,4,flatbuf,root_table);
  for (loc._4_4_ = 0; loc._4_4_ < (int)(newsize - uVar1); loc._4_4_ = loc._4_4_ + 1) {
    *(offset_type *)(puVar2 + (long)loc._4_4_ * 4) = val.o;
  }
  return;
}

Assistant:

void ResizeVector(const reflection::Schema &schema, uoffset_t newsize, T val,
                  const Vector<T> *vec, std::vector<uint8_t> *flatbuf,
                  const reflection::Object *root_table = nullptr) {
  auto delta_elem = static_cast<int>(newsize) - static_cast<int>(vec->size());
  auto newelems = ResizeAnyVector(
      schema, newsize, reinterpret_cast<const VectorOfAny *>(vec), vec->size(),
      static_cast<uoffset_t>(sizeof(T)), flatbuf, root_table);
  // Set new elements to "val".
  for (int i = 0; i < delta_elem; i++) {
    auto loc = newelems + i * sizeof(T);
    auto is_scalar = flatbuffers::is_scalar<T>::value;
    if (is_scalar) {
      WriteScalar(loc, val);
    } else {  // struct
      *reinterpret_cast<T *>(loc) = val;
    }
  }
}